

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRandomFragmentOpTests.cpp
# Opt level: O1

void deqp::gles3::Functional::translateState
               (RenderState *src,FragmentOperationState *dst,RenderTarget *renderTarget)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int i;
  TestFunc TVar7;
  long lVar8;
  undefined1 uVar9;
  uint uVar10;
  float fVar11;
  Vector<float,_4> res;
  undefined8 local_58;
  undefined8 uStack_50;
  float local_48 [6];
  float afStack_30 [4];
  
  iVar2 = renderTarget->m_depthBits;
  uVar10 = 0;
  uVar9 = false;
  iVar3 = renderTarget->m_stencilBits;
  dst->scissorTestEnabled = src->scissorTestEnabled;
  iVar4 = (src->scissorRectangle).bottom;
  iVar5 = (src->scissorRectangle).width;
  iVar6 = (src->scissorRectangle).height;
  (dst->scissorRectangle).left = (src->scissorRectangle).left;
  (dst->scissorRectangle).bottom = iVar4;
  (dst->scissorRectangle).width = iVar5;
  (dst->scissorRectangle).height = iVar6;
  if (0 < iVar3) {
    uVar9 = (undefined1)*(undefined4 *)&src->stencilTestEnabled;
  }
  dst->stencilTestEnabled = (bool)uVar9;
  if (0 < iVar2) {
    uVar10 = *(uint *)&src->depthTestEnabled;
  }
  dst->depthTestEnabled = SUB41(uVar10,0);
  dst->blendMode = (uint)src->blendEnabled;
  dst->numStencilBits = renderTarget->m_stencilBits;
  *(undefined4 *)(dst->colorMask).m_data = *(undefined4 *)(src->colorMask).m_data;
  if ((uVar10 & 1) != 0) {
    TVar7 = sglr::rr_util::mapGLTestFunc(src->depthFunc);
    dst->depthFunc = TVar7;
    dst->depthMask = src->depthWriteMask;
  }
  if (dst->stencilTestEnabled == true) {
    translateStencilState(src->stencil + 1,dst->stencilStates + 1);
    translateStencilState(src->stencil,dst->stencilStates);
  }
  if (src->blendEnabled == true) {
    translateBlendState(&src->blendRGBState,&dst->blendRGBState);
    translateBlendState(&src->blendAState,&dst->blendAState);
    local_48[0] = 0.0;
    local_48[1] = 0.0;
    local_48[2] = 0.0;
    local_48[3] = 0.0;
    lVar8 = 0;
    do {
      afStack_30[lVar8] = 1.0;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    local_58 = 0;
    uStack_50 = 0;
    lVar8 = 0;
    do {
      fVar1 = (src->blendColor).m_data[lVar8];
      fVar11 = afStack_30[lVar8];
      if (fVar1 <= afStack_30[lVar8]) {
        fVar11 = fVar1;
      }
      uVar10 = -(uint)(fVar1 < local_48[lVar8]);
      *(uint *)((long)&local_58 + lVar8 * 4) =
           uVar10 & (uint)local_48[lVar8] | ~uVar10 & (uint)fVar11;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    *(undefined8 *)(dst->blendColor).m_data = local_58;
    *(undefined8 *)((dst->blendColor).m_data + 2) = uStack_50;
  }
  return;
}

Assistant:

void translateState (const RenderState& src, rr::FragmentOperationState& dst, const tcu::RenderTarget& renderTarget)
{
	bool hasDepth		= renderTarget.getDepthBits() > 0;
	bool hasStencil		= renderTarget.getStencilBits() > 0;

	dst.scissorTestEnabled		= src.scissorTestEnabled;
	dst.scissorRectangle		= src.scissorRectangle;
	dst.stencilTestEnabled		= hasStencil && src.stencilTestEnabled;
	dst.depthTestEnabled		= hasDepth && src.depthTestEnabled;
	dst.blendMode				= src.blendEnabled ? rr::BLENDMODE_STANDARD : rr::BLENDMODE_NONE;
	dst.numStencilBits			= renderTarget.getStencilBits();

	dst.colorMask = src.colorMask;

	if (dst.depthTestEnabled)
	{
		dst.depthFunc	= sglr::rr_util::mapGLTestFunc(src.depthFunc);
		dst.depthMask	= src.depthWriteMask;
	}

	if (dst.stencilTestEnabled)
	{
		translateStencilState(src.stencil[rr::FACETYPE_BACK],	dst.stencilStates[rr::FACETYPE_BACK]);
		translateStencilState(src.stencil[rr::FACETYPE_FRONT],	dst.stencilStates[rr::FACETYPE_FRONT]);
	}

	if (src.blendEnabled)
	{
		translateBlendState(src.blendRGBState, dst.blendRGBState);
		translateBlendState(src.blendAState, dst.blendAState);
		dst.blendColor = tcu::clamp(src.blendColor, Vec4(0.0f), Vec4(1.0f));
	}
}